

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

int LoadEXRImageFromMemory
              (EXRImage *exr_image,EXRHeader *exr_header,uchar *memory,size_t size,char **err)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  pointer pvVar7;
  int iVar8;
  size_t sVar9;
  long lVar10;
  ulong *puVar11;
  char *pcVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  uint dx;
  uint uVar16;
  ulong uVar17;
  ulong uStack_110;
  allocator local_f9;
  OffsetData offset_data;
  ulong *local_d0;
  string local_c8;
  ulong local_a8;
  ulong local_a0;
  uint local_94;
  ulong local_90;
  size_t local_88;
  int local_80;
  int local_7c;
  vector<int,_std::allocator<int>_> num_x_tiles;
  vector<int,_std::allocator<int>_> num_y_tiles;
  
  if ((memory == (uchar *)0x0 || exr_image == (EXRImage *)0x0) || size < 8) {
    pcVar12 = "Invalid argument for LoadEXRImageFromMemory";
LAB_001abd0b:
    std::__cxx11::string::string((string *)&local_c8,pcVar12,(allocator *)&offset_data);
    tinyexr::SetErrorMessage(&local_c8,err);
    std::__cxx11::string::~string((string *)&local_c8);
    return -3;
  }
  if ((ulong)exr_header->header_len == 0) {
    pcVar12 = "EXRHeader variable is not initialized.";
    goto LAB_001abd0b;
  }
  if (size < 9) {
    pcVar12 = "Invalid argument for DecodeEXRImage().";
    goto LAB_001abd0b;
  }
  iVar4 = exr_header->compression_type;
  uStack_110 = 0x10;
  if ((iVar4 != 3) && (iVar4 != 0x80)) {
    if (iVar4 == 4) {
      uStack_110 = 0x20;
    }
    else {
      uStack_110 = 1;
    }
  }
  iVar4 = (exr_header->data_window).max_x;
  iVar1 = (exr_header->data_window).min_x;
  iVar8 = iVar4 - iVar1;
  if ((iVar4 < iVar1) || (iVar8 == 0x7fffffff)) {
    pcVar12 = "Invalid data width value";
LAB_001abd86:
    std::__cxx11::string::string((string *)&local_c8,pcVar12,(allocator *)&offset_data);
    tinyexr::SetErrorMessage(&local_c8,err);
    std::__cxx11::string::~string((string *)&local_c8);
    return -4;
  }
  iVar4 = (exr_header->data_window).max_y;
  iVar1 = (exr_header->data_window).min_y;
  iVar6 = iVar4 - iVar1;
  if ((iVar4 < iVar1) || (iVar6 == 0x7fffffff)) {
    pcVar12 = "Invalid data height value";
    goto LAB_001abd86;
  }
  if (0x7fffff < iVar8) {
    pcVar12 = "data width too large.";
    goto LAB_001abd86;
  }
  if (0x7fffff < iVar6) {
    pcVar12 = "data height too large.";
    goto LAB_001abd86;
  }
  puVar11 = (ulong *)(memory + (ulong)exr_header->header_len + 8);
  if (exr_header->tiled == 0) {
    offset_data.offsets.
    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    offset_data.num_x_levels = 0;
    offset_data.num_y_levels = 0;
    offset_data.offsets.
    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    offset_data.offsets.
    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88 = (size_t)exr_header->chunk_count;
    if ((long)local_88 < 1) {
      uVar5 = (ulong)(long)(iVar6 + 1) / uStack_110;
      local_88 = uVar5 + (uStack_110 * uVar5 < (ulong)(long)(iVar6 + 1));
      tinyexr::InitSingleResolutionOffsets(&offset_data,local_88);
    }
    else {
      tinyexr::InitSingleResolutionOffsets(&offset_data,local_88);
    }
  }
  else {
    if (0x800000 < exr_header->tile_size_x) {
      pcVar12 = "tile width too large.";
      goto LAB_001abd86;
    }
    if (0x800000 < exr_header->tile_size_y) {
      pcVar12 = "tile height too large.";
      goto LAB_001abd86;
    }
    offset_data.offsets.
    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    offset_data.num_x_levels = 0;
    offset_data.num_y_levels = 0;
    offset_data.offsets.
    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    offset_data.offsets.
    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    num_x_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    num_x_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    num_x_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    tinyexr::PrecalculateTileInfo(&num_x_tiles,&num_y_tiles,exr_header);
    iVar4 = tinyexr::InitTileOffsets(&offset_data,exr_header,&num_x_tiles,&num_y_tiles);
    if (exr_header->chunk_count != iVar4 && 0 < exr_header->chunk_count) {
      std::__cxx11::string::string((string *)&local_c8,"Invalid offset table size.",&local_f9);
      tinyexr::SetErrorMessage(&local_c8,err);
      std::__cxx11::string::~string((string *)&local_c8);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&num_y_tiles.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&num_x_tiles.super__Vector_base<int,_std::allocator<int>_>);
LAB_001ac1a0:
      iVar4 = -4;
      goto LAB_001ac1a3;
    }
    local_88 = (size_t)iVar4;
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&num_y_tiles.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&num_x_tiles.super__Vector_base<int,_std::allocator<int>_>);
    for (uVar15 = 0; uVar5 = (ulong)uVar15,
        uVar5 < (ulong)(((long)offset_data.offsets.
                               super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)offset_data.offsets.
                              super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x18);
        uVar15 = uVar15 + 1) {
      pvVar7 = offset_data.offsets.
               super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar5].
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      for (uVar16 = 0; uVar14 = (ulong)uVar16,
          uVar14 < (ulong)(((long)offset_data.offsets.
                                  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar5].
                                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7) / 0x18)
          ; uVar16 = uVar16 + 1) {
        uVar13 = 0;
        while( true ) {
          pvVar7 = offset_data.offsets.
                   super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar5].
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)*(pointer *)
                             ((long)&pvVar7[uVar14].
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data + 8) -
                      *(long *)&pvVar7[uVar14].
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data >> 3) <= (ulong)uVar13) break;
          if (memory + size <= puVar11 + 1) {
            std::__cxx11::string::string
                      ((string *)&local_c8,"Insufficient data size in offset table.",
                       (allocator *)&num_x_tiles);
            goto LAB_001ac188;
          }
          if (size <= *puVar11) {
            std::__cxx11::string::string
                      ((string *)&local_c8,"Invalid offset value in DecodeEXRImage.",
                       (allocator *)&num_x_tiles);
            goto LAB_001ac188;
          }
          *(ulong *)(*(long *)&offset_data.offsets.
                               super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar5].
                               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar14].
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data + (ulong)uVar13 * 8) = *puVar11;
          uVar13 = uVar13 + 1;
          puVar11 = puVar11 + 1;
        }
      }
    }
    local_90 = ((long)offset_data.offsets.
                      super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)offset_data.offsets.
                     super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x18;
    for (uVar15 = 0; uVar5 = (ulong)uVar15, uVar5 < local_90; uVar15 = uVar15 + 1) {
      pvVar7 = offset_data.offsets.
               super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar5].
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      for (uVar16 = 0; uVar14 = (ulong)uVar16,
          uVar14 < (ulong)(((long)offset_data.offsets.
                                  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar5].
                                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7) / 0x18)
          ; uVar16 = uVar16 + 1) {
        lVar3 = *(long *)&pvVar7[uVar14].
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data;
        uVar17 = 0;
        while (uVar17 < (ulong)((long)*(pointer *)
                                       ((long)&pvVar7[uVar14].
                                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                               ._M_impl.super__Vector_impl_data + 8) - lVar3 >> 3))
        {
          lVar10 = uVar17 * 8;
          uVar17 = (ulong)((int)uVar17 + 1);
          if (*(long *)(lVar3 + lVar10) < 1) {
            local_7c = exr_header->non_image;
            local_80 = offset_data.num_x_levels;
            local_90 = (ulong)(exr_header->multipart != 0) * 4;
            local_a8 = 0;
            local_d0 = puVar11;
            goto LAB_001ac269;
          }
        }
      }
    }
  }
LAB_001abfbc:
  if (exr_header->tiled == 0) {
    pvVar7 = ((offset_data.offsets.
               super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    for (sVar9 = 0; local_88 != sVar9; sVar9 = sVar9 + 1) {
      if (memory + size <= puVar11 + 1) {
        std::__cxx11::string::string
                  ((string *)&local_c8,"Insufficient data size in offset table.",
                   (allocator *)&num_x_tiles);
        goto LAB_001ac188;
      }
      if (size <= *puVar11) {
        std::__cxx11::string::string
                  ((string *)&local_c8,"Invalid offset value in DecodeEXRImage.",
                   (allocator *)&num_x_tiles);
        goto LAB_001ac188;
      }
      *(ulong *)(*(long *)&(pvVar7->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data + sVar9 * 8) = *puVar11;
      puVar11 = puVar11 + 1;
    }
    sVar9 = 0;
    do {
      if (local_88 == sVar9) goto LAB_001abfcb;
      lVar3 = sVar9 * 8;
      sVar9 = sVar9 + 1;
    } while (*(long *)(*(long *)&(pvVar7->
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                 _M_impl.super__Vector_impl_data + lVar3) != 0);
    sVar9 = 0;
LAB_001ac0cd:
    if (local_88 != sVar9) {
      if ((((long)puVar11 - (long)memory) + 8U < size) &&
         (uVar15 = *(uint *)((long)puVar11 + 4), uVar15 < size)) goto code_r0x001ac0f1;
      std::__cxx11::string::string
                ((string *)&local_c8,"Cannot reconstruct lineOffset table in DecodeEXRImage.",
                 (allocator *)&num_x_tiles);
LAB_001ac188:
      tinyexr::SetErrorMessage(&local_c8,err);
      std::__cxx11::string::~string((string *)&local_c8);
      goto LAB_001ac1a0;
    }
  }
LAB_001abfcb:
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  iVar4 = tinyexr::DecodeChunk(exr_image,exr_header,&offset_data,memory,size,&local_c8);
  if (iVar4 != 0) {
    if (local_c8._M_string_length != 0) {
      tinyexr::SetErrorMessage(&local_c8,err);
    }
    FreeEXRImage(exr_image);
  }
  std::__cxx11::string::~string((string *)&local_c8);
LAB_001ac1a3:
  std::
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::~vector(&offset_data.offsets);
  return iVar4;
LAB_001ac269:
  if ((ulong)(((long)offset_data.offsets.
                     super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)offset_data.offsets.
                    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= local_a8)
  goto LAB_001abfbc;
  pvVar7 = offset_data.offsets.
           super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[local_a8].
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (local_a0 = 0;
      local_a0 <
      (ulong)(((long)offset_data.offsets.
                     super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[local_a8].
                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7) / 0x18);
      local_a0 = (ulong)((int)local_a0 + 1)) {
    for (local_94 = 0;
        pvVar7 = offset_data.offsets.
                 super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[local_a8].
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        (ulong)local_94 <
        (ulong)((long)*(pointer *)
                       ((long)&pvVar7[local_a0].
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data + 8) -
                *(long *)&pvVar7[local_a0].
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data >> 3); local_94 = local_94 + 1) {
      if (local_7c == 0) {
        lVar3 = (long)*(int *)((long)local_d0 + local_90 + 0x10) + local_90 + 0x14;
      }
      else {
        lVar3 = *(long *)((long)local_d0 + local_90 + 0x18) +
                *(long *)((long)local_d0 + local_90 + 0x10) + local_90 + 0x28;
      }
      uVar15 = *(uint *)((long)local_d0 + local_90);
      uVar16 = *(uint *)((long)local_d0 + local_90 + 4);
      uVar5 = (ulong)uVar16;
      uVar13 = *(uint *)((long)local_d0 + local_90 + 8);
      uVar14 = (ulong)uVar13;
      uVar2 = *(uint *)((long)local_d0 + local_90 + 0xc);
      if ((int)(uVar15 | uVar16 | uVar2 | uVar13) < 0) goto LAB_001abfbc;
      iVar4 = exr_header->tile_level_mode;
      if (iVar4 == 2) {
        if ((((offset_data.num_x_levels <= (int)uVar13) || (offset_data.num_y_levels <= (int)uVar2))
            || (uVar14 = (long)offset_data.num_x_levels * (ulong)uVar2 + uVar14,
               (ulong)(((long)offset_data.offsets.
                              super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)offset_data.offsets.
                             super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= uVar14)) ||
           ((pvVar7 = offset_data.offsets.
                      super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar14].
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
            (ulong)(((long)offset_data.offsets.
                           super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar14].
                           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7) / 0x18) <=
            uVar5 || ((ulong)((long)*(pointer *)
                                     ((long)&pvVar7[uVar5].
                                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                             ._M_impl.super__Vector_impl_data + 8) -
                              *(long *)&pvVar7[uVar5].
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data >> 3) <= (ulong)uVar15))))
        goto LAB_001abfbc;
        uVar13 = uVar2 * offset_data.num_x_levels + uVar13;
      }
      else {
        if (iVar4 == 1) {
          if (((offset_data.num_x_levels <= (int)uVar13) || (offset_data.num_y_levels <= (int)uVar2)
              ) || (((ulong)(((long)offset_data.offsets.
                                    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)offset_data.offsets.
                                   super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= uVar14 ||
                    (pvVar7 = offset_data.offsets.
                              super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar14].
                              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)(((long)offset_data.offsets.
                                   super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar14].
                                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7) / 0x18
                           ) <= uVar5)))) goto LAB_001abfbc;
          lVar10 = (long)*(pointer *)
                          ((long)&pvVar7[uVar5].
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data + 8) -
                   *(long *)&pvVar7[uVar5].
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data;
        }
        else {
          if ((((iVar4 != 0) || ((uVar2 | uVar13) != 0)) ||
              (offset_data.offsets.
               super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish ==
               offset_data.offsets.
               super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)) ||
             (pvVar7 = ((offset_data.offsets.
                         super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start,
             (ulong)(((long)((offset_data.offsets.
                              super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7) / 0x18) <=
             uVar5)) goto LAB_001abfbc;
          lVar10 = (long)*(pointer *)
                          ((long)&pvVar7[uVar5].
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data + 8) -
                   *(long *)&pvVar7[uVar5].
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data;
          uVar13 = 0;
        }
        if ((ulong)(lVar10 >> 3) <= (ulong)uVar15) goto LAB_001abfbc;
      }
      *(long *)(*(long *)&offset_data.offsets.
                          super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[(int)uVar13].
                          super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[(int)uVar16].
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data + (long)(int)uVar15 * 8) =
           (long)local_d0 - (long)memory;
      local_d0 = (ulong *)((long)local_d0 + lVar3);
    }
  }
  local_a8 = (ulong)((int)local_a8 + 1);
  goto LAB_001ac269;
code_r0x001ac0f1:
  *(long *)(*(long *)&(pvVar7->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                      _M_impl.super__Vector_impl_data + sVar9 * 8) = (long)puVar11 - (long)memory;
  puVar11 = (ulong *)((long)puVar11 + (ulong)(uVar15 + 8));
  sVar9 = sVar9 + 1;
  goto LAB_001ac0cd;
}

Assistant:

int LoadEXRImageFromMemory(EXRImage *exr_image, const EXRHeader *exr_header,
                           const unsigned char *memory, const size_t size,
                           const char **err) {
  if (exr_image == NULL || memory == NULL ||
      (size < tinyexr::kEXRVersionSize)) {
    tinyexr::SetErrorMessage("Invalid argument for LoadEXRImageFromMemory",
                             err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  if (exr_header->header_len == 0) {
    tinyexr::SetErrorMessage("EXRHeader variable is not initialized.", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  const unsigned char *head = memory;
  const unsigned char *marker = reinterpret_cast<const unsigned char *>(
      memory + exr_header->header_len +
      8);  // +8 for magic number + version header.
  return tinyexr::DecodeEXRImage(exr_image, exr_header, head, marker, size,
                                 err);
}